

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O3

bool __thiscall
baryonyx::itm::
solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>
::
push_and_compute_update_row<baryonyx::bit_array,std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
          (solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>
           *this,bit_array *x,
          reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
          *first,reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                 *last,float kappa,float delta,float theta,float obj_amp)

{
  solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>
  *reduced_cost;
  rc_data *prVar1;
  int k;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *plVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  uint r_size;
  int iVar5;
  __uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
  _Var6;
  long lVar7;
  int iVar8;
  _Head_base<0UL,_int_*,_false> _Var9;
  int *piVar10;
  rc_data *ret;
  rc_data *prVar11;
  rc_data *prVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  undefined1 auVar18 [64];
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_50;
  _Head_base<0UL,_int_*,_false> local_48;
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_40;
  undefined8 local_38;
  undefined1 extraout_var [60];
  
  piVar10 = (first->current)._M_current;
  if (piVar10 == (last->current)._M_current) {
    local_38._0_4_ = 0;
    local_38._4_4_ = 0;
  }
  else {
    local_40._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
    super__Head_base<0UL,_int_*,_false>._M_head_impl =
         (tuple<int_*,_std::default_delete<int[]>_>)((long)this + 0x10);
    reduced_cost = this + 0x60;
    local_38._0_4_ = 0;
    local_38._4_4_ = 0;
    do {
      k = piVar10[-1];
      sparse_matrix<int>::row
                ((sparse_matrix<int> *)&local_50,
                 (int)local_40._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                      super__Head_base<0UL,_int_*,_false>._M_head_impl);
      if ((tuple<int_*,_std::default_delete<int[]>_>)local_48._M_head_impl !=
          (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)
          local_50._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl) {
        lVar17 = *(long *)(this + 0x50);
        _Var9._M_head_impl = local_48._M_head_impl;
        do {
          iVar5 = *_Var9._M_head_impl;
          _Var9._M_head_impl = _Var9._M_head_impl + 8;
          *(float *)(lVar17 + (long)iVar5 * 4) = theta * *(float *)(lVar17 + (long)iVar5 * 4);
        } while ((tuple<int_*,_std::default_delete<int[]>_>)_Var9._M_head_impl !=
                 (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)
                 local_50._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl);
      }
      r_size = solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
               ::compute_reduced_costs<baryonyx::bit_array>
                         ((solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
                           *)this,(row_iterator)local_48._M_head_impl,
                          (row_iterator)
                          local_50._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                          super__Head_base<0UL,_int_*,_false>._M_head_impl,x);
      if (r_size != 0) {
        lVar17 = 0;
        _Var6._M_t.
        super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
        .
        super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data_*,_false>
        ._M_head_impl =
             *(tuple<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
               *)reduced_cost;
        do {
          auVar18._0_4_ =
               quadratic_cost_type<float>::operator()
                         (*(quadratic_cost_type<float> **)(this + 0x160),
                          ((row_iterator)
                          ((long)local_48._M_head_impl +
                          (long)*(int *)((long)_Var6._M_t.
                                               super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
                                               .
                                               super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data_*,_false>
                                               ._M_head_impl + 4 + lVar17) * 8))->column,x);
          auVar18._4_60_ = extraout_var;
          _Var6._M_t.
          super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
          .
          super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data_*,_false>
          ._M_head_impl =
               *(tuple<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
                 *)(this + 0x60);
          auVar3 = vfmadd213ss_fma(auVar18._0_16_,ZEXT416((uint)obj_amp),
                                   ZEXT416(*(uint *)((long)_Var6._M_t.
                                                                                                                      
                                                  super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
                                                  .
                                                  super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data_*,_false>
                                                  ._M_head_impl + lVar17)));
          *(int *)((long)_Var6._M_t.
                         super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
                         .
                         super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data_*,_false>
                         ._M_head_impl + lVar17) = auVar3._0_4_;
          lVar17 = lVar17 + 0xc;
        } while ((ulong)r_size * 0xc != lVar17);
      }
      lVar17 = (long)k;
      switch(*(undefined1 *)(*(long *)(this + 0x68) + lVar17)) {
      case 0:
        if (1 < (int)r_size) {
          lVar7 = (long)(int)r_size;
          prVar12 = *(rc_data **)(this + 0x60);
          plVar2 = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)
                    (this + 8);
          prVar1 = prVar12 + lVar7;
          std::
          __introsort_loop<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar12,prVar1,(int)LZCOUNT(lVar7) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar12,prVar1);
          lVar7 = lVar7 * 0xc + -0xc;
          prVar11 = prVar12;
          do {
            prVar11 = prVar11 + 1;
            if ((prVar12->value != prVar11->value) || (NAN(prVar12->value) || NAN(prVar11->value)))
            {
              std::
              shuffle<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                        (prVar12,prVar11,plVar2);
              prVar12 = prVar11;
            }
            lVar7 = lVar7 + -0xc;
          } while (lVar7 != 0);
          std::
          shuffle<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                    (prVar12,prVar1,plVar2);
        }
        iVar8 = *(int *)(*(long *)(this + 0x70) + lVar17 * 0xc);
        iVar13 = *(int *)(*(long *)(this + 0x70) + 4 + lVar17 * 0xc);
        goto LAB_0054b175;
      case 2:
        if (1 < (int)r_size) {
          lVar7 = (long)(int)r_size;
          prVar12 = *(rc_data **)(this + 0x60);
          plVar2 = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)
                    (this + 8);
          prVar1 = prVar12 + lVar7;
          std::
          __introsort_loop<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar12,prVar1,(int)LZCOUNT(lVar7) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar12,prVar1);
          lVar7 = lVar7 * 0xc + -0xc;
          prVar11 = prVar12;
          do {
            prVar11 = prVar11 + 1;
            if ((prVar12->value != prVar11->value) || (NAN(prVar12->value) || NAN(prVar11->value)))
            {
              std::
              shuffle<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                        (prVar12,prVar11,plVar2);
              prVar12 = prVar11;
            }
            lVar7 = lVar7 + -0xc;
          } while (lVar7 != 0);
          std::
          shuffle<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                    (prVar12,prVar1,plVar2);
        }
        iVar8 = *(int *)(*(long *)(this + 0x70) + lVar17 * 0xc);
        iVar13 = *(int *)(*(long *)(this + 0x70) + 4 + lVar17 * 0xc);
        if (-1 < (int)r_size) {
          iVar5 = -2;
          lVar17 = -1;
          iVar15 = 0;
          do {
            iVar14 = (int)lVar17;
            if (iVar13 < iVar15) {
              iVar14 = iVar5;
            }
            if (iVar15 < iVar8) {
              iVar14 = iVar5;
            }
            iVar5 = iVar14;
            if (iVar5 == -2) {
              if (lVar17 + 1U == (ulong)r_size) break;
            }
            else if ((0.0 < *(float *)((long)*(__uniq_ptr_data<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>,_true,_true>
                                               *)reduced_cost + 0xc + lVar17 * 0xc)) ||
                    (lVar17 + 1U == (ulong)r_size)) goto LAB_0054b17d;
            lVar17 = lVar17 + 1;
            iVar15 = iVar15 + *(int *)((long)*(__uniq_ptr_data<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>,_true,_true>
                                               *)reduced_cost + 8 + lVar17 * 0xc);
          } while( true );
        }
LAB_0054b175:
        iVar5 = branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::
                solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>::rc_data[]>>>
                          ((branch_and_bound_solver<baryonyx::itm::minimize_tag,float> *)
                           (this + 0x80),
                           (unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
                            *)reduced_cost,r_size,iVar8,iVar13);
        break;
      case 3:
        if (1 < (int)r_size) {
          lVar7 = (long)(int)r_size;
          prVar12 = *(rc_data **)(this + 0x60);
          plVar2 = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)
                    (this + 8);
          prVar1 = prVar12 + lVar7;
          std::
          __introsort_loop<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar12,prVar1,(int)LZCOUNT(lVar7) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar12,prVar1);
          lVar7 = lVar7 * 0xc + -0xc;
          prVar11 = prVar12;
          do {
            prVar11 = prVar11 + 1;
            if ((prVar12->value != prVar11->value) || (NAN(prVar12->value) || NAN(prVar11->value)))
            {
              std::
              shuffle<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                        (prVar12,prVar11,plVar2);
              prVar12 = prVar11;
            }
            lVar7 = lVar7 + -0xc;
          } while (lVar7 != 0);
          std::
          shuffle<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                    (prVar12,prVar1,plVar2);
        }
        if (-1 < (int)r_size) {
          lVar7 = -1;
          iVar13 = 0;
          iVar8 = -2;
          do {
            iVar5 = (int)lVar7;
            if (*(int *)(*(long *)(this + 0x70) + 4 + lVar17 * 0xc) < iVar13) {
              iVar5 = iVar8;
            }
            if (iVar13 < *(int *)(*(long *)(this + 0x70) + lVar17 * 0xc)) {
              iVar5 = iVar8;
            }
            if (iVar5 == -2) {
              if (lVar7 + 1U == (ulong)r_size) break;
            }
            else if ((0.0 < *(float *)((long)*(__uniq_ptr_data<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>,_true,_true>
                                               *)reduced_cost + 0xc + lVar7 * 0xc)) ||
                    (lVar7 + 1U == (ulong)r_size)) goto LAB_0054b17d;
            lVar7 = lVar7 + 1;
            iVar13 = iVar13 + *(int *)((long)*(__uniq_ptr_data<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>,_true,_true>
                                               *)reduced_cost + 8 + lVar7 * 0xc);
            iVar8 = iVar5;
          } while( true );
        }
      case 1:
        iVar5 = exhaustive_solver<baryonyx::itm::minimize_tag,float>::
                solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>::rc_data[]>>>
                          ((exhaustive_solver<baryonyx::itm::minimize_tag,float> *)(this + 0xe8),k,
                           (unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
                            *)reduced_cost,r_size);
        break;
      default:
        if (1 < (int)r_size) {
          lVar7 = (long)(int)r_size;
          prVar12 = *(rc_data **)(this + 0x60);
          plVar2 = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)
                    (this + 8);
          prVar1 = prVar12 + lVar7;
          std::
          __introsort_loop<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar12,prVar1,(int)LZCOUNT(lVar7) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar12,prVar1);
          lVar7 = lVar7 * 0xc + -0xc;
          prVar11 = prVar12;
          do {
            prVar11 = prVar11 + 1;
            if ((prVar12->value != prVar11->value) || (NAN(prVar12->value) || NAN(prVar11->value)))
            {
              std::
              shuffle<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                        (prVar12,prVar11,plVar2);
              prVar12 = prVar11;
            }
            lVar7 = lVar7 + -0xc;
          } while (lVar7 != 0);
          std::
          shuffle<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                    (prVar12,prVar1,plVar2);
        }
        if ((int)r_size < 0) {
          iVar5 = -2;
        }
        else {
          uVar16 = 0xffffffffffffffff;
          iVar13 = 0;
          piVar10 = (int *)((long)*(__uniq_ptr_data<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>,_true,_true>
                                    *)reduced_cost + 8);
          iVar8 = -2;
          do {
            iVar5 = (int)uVar16;
            if (*(int *)(*(long *)(this + 0x70) + 4 + lVar17 * 0xc) < iVar13) {
              iVar5 = iVar8;
            }
            if (iVar13 < *(int *)(*(long *)(this + 0x70) + lVar17 * 0xc)) {
              iVar5 = iVar8;
            }
            if ((iVar5 != -2) && (0.0 < (float)piVar10[-2])) break;
            iVar13 = iVar13 + *piVar10;
            uVar16 = uVar16 + 1;
            piVar10 = piVar10 + 3;
            iVar8 = iVar5;
          } while (r_size != uVar16);
        }
      }
LAB_0054b17d:
      bVar4 = local_affect<baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*>
                        (this,x,(row_value *)local_48._M_head_impl,k,iVar5,r_size,kappa,delta);
      local_38._0_1_ = (byte)local_38 | bVar4;
      piVar10 = (first->current)._M_current + -1;
      (first->current)._M_current = piVar10;
    } while (piVar10 != (last->current)._M_current);
  }
  return (bool)((byte)local_38 & 1);
}

Assistant:

bool push_and_compute_update_row(Xtype& x,
                                     Iterator first,
                                     Iterator last,
                                     Float kappa,
                                     Float delta,
                                     Float theta,
                                     Float obj_amp)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("push-update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto r_size =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            // Before sort and select variables, we apply the push method: for
            // each reduces cost, we had the cost multiply with an objective
            // amplifier.

            for (int i = 0; i != r_size; ++i)
                R[i].value +=
                  obj_amp * c((std::get<0>(it) + R[i].id)->column, x);

            Float pi_change;
            int selected;

            switch (Z[k]) {
            case subsolver_type::branch_and_bound:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = bb.solve(R, r_size, b[k].min, b[k].max);
                break;
            case subsolver_type::exhaustive:
                selected = ex.solve(k, R, r_size);
                break;
            case subsolver_type::unconstrained_branch_and_bound:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = select_variables(r_size, b[k].min, b[k].max);
                if (selected == -2)
                    selected = bb.solve(R, r_size, b[k].min, b[k].max);
                break;
            case subsolver_type::unconstrained_exhaustive:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = select_variables(r_size, b[k].min, b[k].max);
                if (selected == -2)
                    selected = ex.solve(k, R, r_size);
                break;
            case subsolver_type::linear:
            default:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = select_variables_101(r_size, b[k].min, b[k].max);
                break;
            }

            pi_change = local_affect(
              x, std::get<0>(it), k, selected, r_size, kappa, delta);
            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }